

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::Printf<std::__cxx11::string,float&,float&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               float *args_1,float *args_2)

{
  float *in_R9;
  string s;
  string local_28;
  
  StringPrintf<std::__cxx11::string,float&,float&>
            (&local_28,(pbrt *)fmt,(char *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,args_2,
             in_R9);
  fputs(local_28._M_dataplus._M_p,_stdout);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}